

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::GridProgram::shadeVertices
          (GridProgram *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  Vec4 v;
  Vec4 local_68;
  VertexAttrib *local_50;
  Vec4 local_48;
  
  if (0 < numPackets) {
    local_50 = inputs + 1;
    uVar2 = 0;
    do {
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_68,inputs,packets[uVar2]->instanceNdx,packets[uVar2]->vertexNdx);
      local_48.m_data[0] = 0.0;
      local_48.m_data[1] = 0.0;
      local_48.m_data[2] = 0.0;
      local_48.m_data[3] = 0.0;
      rr::readVertexAttrib(&local_48,local_50,packets[uVar2]->instanceNdx,packets[uVar2]->vertexNdx)
      ;
      pVVar1 = packets[uVar2];
      (pVVar1->position).m_data[0] = local_68.m_data[0] + local_48.m_data[0];
      (pVVar1->position).m_data[1] = local_68.m_data[1] + local_48.m_data[1];
      (pVVar1->position).m_data[2] = local_68.m_data[2] + local_48.m_data[2];
      (pVVar1->position).m_data[3] = local_68.m_data[3] + local_48.m_data[3];
      local_68.m_data[0] = 0.0;
      local_68.m_data[1] = 0.0;
      local_68.m_data[2] = 0.0;
      local_68.m_data[3] = 0.0;
      rr::readVertexAttrib
                (&local_68,inputs + 2,packets[uVar2]->instanceNdx,packets[uVar2]->vertexNdx);
      pVVar1 = packets[uVar2];
      *(undefined8 *)&pVVar1->outputs[0].v = local_68.m_data._0_8_;
      *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = local_68.m_data._8_8_;
      uVar2 = uVar2 + 1;
    } while ((uint)numPackets != uVar2);
  }
  return;
}

Assistant:

void GridProgram::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int ndx = 0; ndx < numPackets; ++ndx)
	{
		packets[ndx]->position = rr::readVertexAttribFloat(inputs[0], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx) + rr::readVertexAttribFloat(inputs[1], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
		packets[ndx]->outputs[0] = rr::readVertexAttribFloat(inputs[2], packets[ndx]->instanceNdx, packets[ndx]->vertexNdx);
	}
}